

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

void ImPlot::ShowAltLegend
               (char *title_id,ImPlotOrientation orientation,ImVec2 size,bool interactable)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ImGuiWindow *this;
  ImDrawList *this_00;
  ImVec2 IVar5;
  ImVec4 *pIVar6;
  ImGuiContext *pIVar7;
  ImPlotContext *pIVar8;
  bool bVar9;
  ImGuiID key;
  ImU32 IVar10;
  uint uVar11;
  ImPlotPlot *plot;
  ImVec4 *pIVar12;
  ImGuiIO *pIVar13;
  float *pfVar14;
  ImGuiWindow *Window;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  float fVar15;
  float fVar16;
  ImRect bb_frame;
  ImRect legend_bb;
  ImRect local_a0;
  ImPlotOrientation local_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  ImRect local_68;
  ImVec4 local_58;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  pIVar8 = GImPlot;
  pIVar7 = GImGui;
  this = GImGui->CurrentWindow;
  if (this->SkipItems != false) {
    return;
  }
  local_88._8_4_ = in_XMM0_Dc;
  local_88._0_8_ = size;
  local_88._12_4_ = in_XMM0_Dd;
  this_00 = this->DrawList;
  local_8c = orientation;
  key = ImGuiWindow::GetID(this,title_id,(char *)0x0);
  plot = ImPool<ImPlotPlot>::GetByKey(&GImPlot->Plots,key);
  if (plot == (ImPlotPlot *)0x0) {
    fVar15 = (pIVar8->Style).LegendPadding.x;
    fVar16 = (pIVar8->Style).LegendPadding.y;
    fVar15 = fVar15 + fVar15;
    fVar16 = fVar16 + fVar16;
    local_78 = ZEXT816(0);
  }
  else {
    IVar5 = CalcLegendSize(plot,&(pIVar8->Style).LegendInnerPadding,&(pIVar8->Style).LegendSpacing,
                           local_8c);
    fVar15 = (pIVar8->Style).LegendPadding.x;
    fVar16 = (pIVar8->Style).LegendPadding.y;
    local_78._8_4_ = extraout_XMM0_Dc;
    local_78._0_4_ = IVar5.x;
    local_78._4_4_ = IVar5.y;
    local_78._12_4_ = extraout_XMM0_Dd;
    fVar15 = fVar15 + fVar15 + IVar5.x;
    fVar16 = fVar16 + fVar16 + IVar5.y;
  }
  IVar5 = ImGui::CalcItemSize((ImVec2)local_88._0_8_,fVar15,fVar16);
  local_a0.Max.x = (this->DC).CursorPos.x + IVar5.x;
  local_a0.Max.y = IVar5.y + (this->DC).CursorPos.y;
  local_a0.Min = (this->DC).CursorPos;
  ImGui::ItemSize(&local_a0,-1.0);
  bVar9 = ImGui::ItemAdd(&local_a0,0,&local_a0,0);
  if (!bVar9) {
    return;
  }
  local_88._8_8_ = 0;
  local_88._0_4_ = local_a0.Min.x;
  local_88._4_4_ = local_a0.Min.y;
  local_48 = local_a0.Max;
  uStack_40 = 0;
  fVar15 = (GImPlot->Style).Colors[5].w;
  if ((fVar15 != -1.0) || (NAN(fVar15))) {
    pIVar12 = (GImPlot->Style).Colors + 5;
    pIVar6 = (GImPlot->Style).Colors + 5;
  }
  else {
    pIVar12 = ImGui::GetStyleColorVec4(7);
    pIVar6 = pIVar12;
  }
  local_58.x = pIVar12->x;
  local_58.y = pIVar12->y;
  uVar1 = pIVar6->z;
  uVar3 = pIVar6->w;
  local_58.z = (float)uVar1;
  local_58.w = (float)uVar3;
  IVar10 = ImGui::ColorConvertFloat4ToU32(&local_58);
  ImGui::RenderFrame((ImVec2)local_88._0_8_,local_48,IVar10,true,(pIVar7->Style).FrameRounding);
  ImDrawList::PushClipRect(this_00,local_a0.Min,local_a0.Max,true);
  if (plot == (ImPlotPlot *)0x0) goto LAB_001bb6bf;
  local_68.Min.x =
       (float)(int)(((local_a0.Min.x + local_a0.Max.x) * 0.5 - (float)local_78._0_4_ * 0.5) + 0.5);
  local_68.Min.y =
       (float)(int)(((local_a0.Min.y + local_a0.Max.y) * 0.5 - (float)local_78._4_4_ * 0.5) + 0.5);
  local_68.Max.x = (float)local_78._0_4_ + local_68.Min.x;
  local_68.Max.y = (float)local_78._4_4_ + local_68.Min.y;
  if (interactable) {
    pIVar13 = ImGui::GetIO();
    fVar15 = (pIVar13->MousePos).x;
    if (fVar15 < local_a0.Min.x) goto LAB_001bb553;
    fVar16 = (pIVar13->MousePos).y;
    uVar11 = 0;
    if ((local_a0.Min.y <= fVar16) && (fVar15 < local_a0.Max.x)) {
      uVar11 = (uint)(fVar16 < local_a0.Max.y);
    }
  }
  else {
LAB_001bb553:
    uVar11 = 0;
  }
  local_88._0_4_ = uVar11;
  fVar15 = (GImPlot->Style).Colors[8].w;
  if ((fVar15 != -1.0) || (NAN(fVar15))) {
    pIVar12 = (GImPlot->Style).Colors + 8;
    pIVar6 = (GImPlot->Style).Colors + 8;
  }
  else {
    pIVar12 = ImGui::GetStyleColorVec4(4);
    pIVar6 = pIVar12;
  }
  local_58.x = pIVar12->x;
  local_58.y = pIVar12->y;
  uVar2 = pIVar6->z;
  uVar4 = pIVar6->w;
  local_58.z = (float)uVar2;
  local_58.w = (float)uVar4;
  IVar10 = ImGui::ColorConvertFloat4ToU32(&local_58);
  local_78._0_4_ = IVar10;
  fVar15 = (GImPlot->Style).Colors[9].w;
  if ((fVar15 != -1.0) || (NAN(fVar15))) {
    pIVar12 = (GImPlot->Style).Colors + 9;
    pfVar14 = &(GImPlot->Style).Colors[9].z;
  }
  else {
    fVar15 = (GImPlot->Style).Colors[7].w;
    if ((fVar15 != -1.0) || (NAN(fVar15))) {
      pIVar12 = (GImPlot->Style).Colors + 7;
      pfVar14 = &(GImPlot->Style).Colors[7].z;
    }
    else {
      pIVar12 = ImGui::GetStyleColorVec4(5);
      pfVar14 = &pIVar12->z;
    }
  }
  local_58.x = pIVar12->x;
  local_58.y = pIVar12->y;
  local_58.z = (float)*(undefined8 *)pfVar14;
  local_58.w = (float)((ulong)*(undefined8 *)pfVar14 >> 0x20);
  IVar10 = ImGui::ColorConvertFloat4ToU32(&local_58);
  ImDrawList::AddRectFilled(this_00,&local_68.Min,&local_68.Max,local_78._0_4_,0.0,0);
  ImDrawList::AddRect(this_00,&local_68.Min,&local_68.Max,IVar10,0.0,0,1.0);
  ShowLegendEntries(plot,&local_68,local_88[0],&(pIVar8->Style).LegendInnerPadding,
                    &(pIVar8->Style).LegendSpacing,local_8c,this_00);
LAB_001bb6bf:
  ImDrawList::PopClipRect(this_00);
  return;
}

Assistant:

void ShowAltLegend(const char* title_id, ImPlotOrientation orientation, const ImVec2 size, bool interactable) {
    ImPlotContext& gp    = *GImPlot;
    ImGuiContext &G      = *GImGui;
    ImGuiWindow * Window = G.CurrentWindow;
    if (Window->SkipItems)
        return;
    ImDrawList &DrawList = *Window->DrawList;
    ImPlotPlot* plot = GetPlot(title_id);
    ImVec2 legend_size;
    ImVec2 default_size = gp.Style.LegendPadding * 2;
    if (plot != NULL) {
        legend_size  = CalcLegendSize(*plot, gp.Style.LegendInnerPadding, gp.Style.LegendSpacing, orientation);
        default_size = legend_size + gp.Style.LegendPadding * 2;
    }
    ImVec2 frame_size = ImGui::CalcItemSize(size, default_size.x, default_size.y);
    ImRect bb_frame = ImRect(Window->DC.CursorPos, Window->DC.CursorPos + frame_size);
    ImGui::ItemSize(bb_frame);
    if (!ImGui::ItemAdd(bb_frame, 0, &bb_frame))
        return;
    ImGui::RenderFrame(bb_frame.Min, bb_frame.Max, GetStyleColorU32(ImPlotCol_FrameBg), true, G.Style.FrameRounding);
    DrawList.PushClipRect(bb_frame.Min, bb_frame.Max, true);
    if (plot != NULL) {
        const ImVec2 legend_pos  = GetLocationPos(bb_frame, legend_size, 0, gp.Style.LegendPadding);
        const ImRect legend_bb(legend_pos, legend_pos + legend_size);
        interactable = interactable && bb_frame.Contains(ImGui::GetIO().MousePos);
        // render legend box
        ImU32  col_bg      = GetStyleColorU32(ImPlotCol_LegendBg);
        ImU32  col_bd      = GetStyleColorU32(ImPlotCol_LegendBorder);
        DrawList.AddRectFilled(legend_bb.Min, legend_bb.Max, col_bg);
        DrawList.AddRect(legend_bb.Min, legend_bb.Max, col_bd);
        // render entries
        ShowLegendEntries(*plot, legend_bb, interactable, gp.Style.LegendInnerPadding, gp.Style.LegendSpacing, orientation, DrawList);
    }
    DrawList.PopClipRect();
}